

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_get_rows(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  size_t sVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  int64_t iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  code *pcVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined8 uVar23;
  
  pgVar1 = dst->src[0];
  switch(pgVar1->type) {
  case GGML_TYPE_F32:
  case GGML_TYPE_I32:
    pgVar3 = dst->src[1];
    lVar4 = pgVar1->ne[1];
    sVar2 = pgVar1->nb[1];
    iVar5 = pgVar1->ne[0];
    sVar6 = dst->nb[3];
    sVar7 = pgVar1->nb[2];
    sVar8 = pgVar3->nb[0];
    sVar10 = pgVar1->nb[3];
    sVar11 = pgVar3->nb[1];
    sVar12 = pgVar3->nb[2];
    lVar9 = pgVar3->ne[0];
    sVar13 = dst->nb[1];
    sVar14 = dst->nb[2];
    lVar18 = pgVar3->ne[1] * lVar9;
    lVar17 = ggml_nelements(pgVar3);
    iVar16 = (int)((lVar17 + -1 + (long)params->nth) / (long)params->nth);
    lVar22 = (long)params->ith * (long)iVar16;
    iVar16 = iVar16 + (int)lVar22;
    if (lVar17 <= iVar16) {
      iVar16 = (int)lVar17;
    }
    for (; lVar22 < iVar16; lVar22 = lVar22 + 1) {
      lVar17 = lVar22 / lVar18;
      lVar20 = lVar22 % lVar18;
      lVar19 = lVar20 / lVar9;
      lVar20 = lVar20 % lVar9;
      lVar21 = (long)*(int *)((long)pgVar3->data +
                             lVar17 * sVar12 + lVar19 * sVar11 + lVar20 * sVar8);
      if ((lVar21 < 0) || (lVar4 <= lVar21)) {
        uVar23 = 0x10d1;
LAB_0013a11c:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                   ,uVar23,"GGML_ASSERT(%s) failed","i01 >= 0 && i01 < ne01");
      }
      ggml_vec_cpy_f32((int)iVar5,
                       (float *)((long)dst->data +
                                lVar19 * sVar14 + lVar17 * sVar6 + lVar20 * sVar13),
                       (float *)((long)pgVar1->data +
                                lVar17 * sVar10 + lVar19 * sVar7 + lVar21 * sVar2));
    }
    break;
  case GGML_TYPE_F16:
    pgVar3 = dst->src[1];
    lVar4 = pgVar1->ne[1];
    sVar2 = pgVar1->nb[1];
    iVar5 = pgVar1->ne[0];
    sVar6 = dst->nb[3];
    sVar7 = pgVar1->nb[2];
    sVar8 = pgVar3->nb[0];
    sVar10 = pgVar1->nb[3];
    sVar11 = pgVar3->nb[1];
    sVar12 = pgVar3->nb[2];
    lVar9 = pgVar3->ne[0];
    sVar13 = dst->nb[1];
    sVar14 = dst->nb[2];
    lVar18 = pgVar3->ne[1] * lVar9;
    lVar17 = ggml_nelements(pgVar3);
    iVar16 = (int)((lVar17 + -1 + (long)params->nth) / (long)params->nth);
    lVar22 = (long)params->ith * (long)iVar16;
    iVar16 = iVar16 + (int)lVar22;
    if (lVar17 <= iVar16) {
      iVar16 = (int)lVar17;
    }
    for (; lVar22 < iVar16; lVar22 = lVar22 + 1) {
      lVar17 = lVar22 / lVar18;
      lVar21 = lVar22 % lVar18;
      lVar19 = lVar21 / lVar9;
      lVar21 = lVar21 % lVar9;
      lVar20 = (long)*(int *)((long)pgVar3->data +
                             lVar17 * sVar12 + lVar19 * sVar11 + lVar21 * sVar8);
      if ((lVar20 < 0) || (lVar4 <= lVar20)) {
        uVar23 = 0x107f;
        goto LAB_0013a11c;
      }
      ggml_fp16_to_fp32_row
                ((long)pgVar1->data + lVar17 * sVar10 + lVar19 * sVar7 + lVar20 * sVar2,
                 (long)dst->data + lVar19 * sVar14 + lVar17 * sVar6 + lVar21 * sVar13,iVar5);
    }
    break;
  case GGML_TYPE_Q4_0:
  case GGML_TYPE_Q4_1:
  case GGML_TYPE_Q5_0:
  case GGML_TYPE_Q5_1:
  case GGML_TYPE_Q8_0:
  case GGML_TYPE_Q8_1:
  case GGML_TYPE_Q2_K:
  case GGML_TYPE_Q3_K:
  case GGML_TYPE_Q4_K:
  case GGML_TYPE_Q5_K:
  case GGML_TYPE_Q6_K:
  case GGML_TYPE_IQ2_XXS:
  case GGML_TYPE_IQ2_XS:
  case GGML_TYPE_IQ3_XXS:
  case GGML_TYPE_IQ1_S:
  case GGML_TYPE_IQ4_NL:
  case GGML_TYPE_IQ3_S:
  case GGML_TYPE_IQ2_S:
  case GGML_TYPE_IQ4_XS:
  case GGML_TYPE_IQ1_M:
  case GGML_TYPE_TQ1_0:
  case GGML_TYPE_TQ2_0:
    sVar2 = pgVar1->nb[1];
    pgVar3 = dst->src[1];
    lVar4 = pgVar1->ne[1];
    iVar5 = pgVar1->ne[0];
    sVar6 = pgVar1->nb[3];
    sVar7 = pgVar1->nb[2];
    sVar8 = pgVar3->nb[0];
    lVar9 = pgVar3->ne[0];
    sVar10 = pgVar3->nb[1];
    lVar22 = pgVar3->ne[1] * lVar9;
    sVar11 = pgVar3->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    sVar14 = dst->nb[3];
    lVar17 = ggml_nelements(pgVar3);
    lVar18 = ggml_get_type_traits(pgVar1->type);
    pcVar15 = *(code **)(lVar18 + 0x28);
    iVar16 = (int)((lVar17 + -1 + (long)params->nth) / (long)params->nth);
    lVar18 = (long)params->ith * (long)iVar16;
    iVar16 = iVar16 + (int)lVar18;
    if (lVar17 <= iVar16) {
      iVar16 = (int)lVar17;
    }
    for (; lVar18 < iVar16; lVar18 = lVar18 + 1) {
      lVar17 = lVar18 / lVar22;
      lVar21 = lVar18 % lVar22;
      lVar19 = lVar21 / lVar9;
      lVar21 = lVar21 % lVar9;
      lVar20 = (long)*(int *)((long)pgVar3->data +
                             lVar17 * sVar11 + lVar19 * sVar10 + lVar21 * sVar8);
      if ((lVar20 < 0) || (lVar4 <= lVar20)) {
        uVar23 = 0x1056;
        goto LAB_0013a11c;
      }
      (*pcVar15)((long)pgVar1->data + lVar17 * sVar6 + lVar19 * sVar7 + lVar20 * sVar2,
                 (long)dst->data + lVar19 * sVar13 + lVar17 * sVar14 + lVar21 * sVar12,iVar5);
    }
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x1108,"fatal error");
  case GGML_TYPE_BF16:
    pgVar3 = dst->src[1];
    lVar4 = pgVar1->ne[1];
    sVar2 = pgVar1->nb[1];
    iVar5 = pgVar1->ne[0];
    sVar6 = dst->nb[3];
    sVar7 = pgVar1->nb[2];
    sVar8 = pgVar3->nb[0];
    sVar10 = pgVar1->nb[3];
    sVar11 = pgVar3->nb[1];
    sVar12 = pgVar3->nb[2];
    lVar9 = pgVar3->ne[0];
    sVar13 = dst->nb[1];
    sVar14 = dst->nb[2];
    lVar18 = pgVar3->ne[1] * lVar9;
    lVar17 = ggml_nelements(pgVar3);
    iVar16 = (int)((lVar17 + -1 + (long)params->nth) / (long)params->nth);
    lVar22 = (long)params->ith * (long)iVar16;
    iVar16 = iVar16 + (int)lVar22;
    if (lVar17 <= iVar16) {
      iVar16 = (int)lVar17;
    }
    for (; lVar22 < iVar16; lVar22 = lVar22 + 1) {
      lVar17 = lVar22 / lVar18;
      lVar21 = lVar22 % lVar18;
      lVar19 = lVar21 / lVar9;
      lVar21 = lVar21 % lVar9;
      lVar20 = (long)*(int *)((long)pgVar3->data +
                             lVar17 * sVar12 + lVar19 * sVar11 + lVar21 * sVar8);
      if ((lVar20 < 0) || (lVar4 <= lVar20)) {
        uVar23 = 0x10a8;
        goto LAB_0013a11c;
      }
      ggml_bf16_to_fp32_row
                ((long)pgVar1->data + lVar17 * sVar10 + lVar19 * sVar7 + lVar20 * sVar2,
                 (long)dst->data + lVar19 * sVar14 + lVar17 * sVar6 + lVar21 * sVar13,iVar5);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_get_rows(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_get_rows_q(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_get_rows_f16(params, dst);
            } break;
        case GGML_TYPE_BF16:
            {
                ggml_compute_forward_get_rows_bf16(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_get_rows_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    //static bool first = true;
    //printf("ne0 = %d, ne1 = %d, ne2 = %d\n", dst->ne[0], dst->ne[1], dst->ne[2]);
    //if (first) {
    //    first = false;
    //} else {
    //    for (int k = 0; k < dst->ne[1]; ++k) {
    //        for (int j = 0; j < dst->ne[0]/16; ++j) {
    //            for (int i = 0; i < 16; ++i) {
    //                printf("%8.4f ", ((float *) dst->data)[k*dst->ne[0] + j*16 + i]);
    //            }
    //            printf("\n");
    //        }
    //        printf("\n");
    //    }
    //    printf("\n");
    //    exit(0);
    //}
}